

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommyarrayblk.c
# Opt level: O0

void tommy_arrayblk_grow(tommy_arrayblk *array,tommy_count_t count)

{
  long lVar1;
  uint count_00;
  void *element;
  long in_FS_OFFSET;
  void **ptr;
  tommy_count_t block_mac;
  tommy_count_t block_max;
  tommy_count_t count_local;
  tommy_arrayblk *array_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (array->count < count) {
    array->count = count;
    count_00 = count + 0xfff >> 0xc;
    ptr._4_4_ = tommy_array_size(&array->block);
    if (ptr._4_4_ < count_00) {
      tommy_array_grow(&array->block,count_00);
      for (; ptr._4_4_ < count_00; ptr._4_4_ = ptr._4_4_ + 1) {
        element = calloc(0x1000,8);
        tommy_array_set(&array->block,ptr._4_4_,element);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void tommy_arrayblk_grow(tommy_arrayblk* array, tommy_count_t count)
{
	tommy_count_t block_max;
	tommy_count_t block_mac;

	if (array->count >= count)
		return;
	array->count = count;

	block_max = (count + TOMMY_ARRAYBLK_SIZE - 1) / TOMMY_ARRAYBLK_SIZE;
	block_mac = tommy_array_size(&array->block);

	if (block_mac < block_max) {
		/* grow the block array */
		tommy_array_grow(&array->block, block_max);

		/* allocate new blocks */
		while (block_mac < block_max) {
			void** ptr = tommy_cast(void**, tommy_calloc(TOMMY_ARRAYBLK_SIZE, sizeof(void*)));

			/* set the new block */
			tommy_array_set(&array->block, block_mac, ptr);

			++block_mac;
		}
	}
}